

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestrictionsConfig.h
# Opt level: O0

RestrictionsConfig *
jaegertracing::baggage::RestrictionsConfig::parse
          (RestrictionsConfig *__return_storage_ptr__,Node *configYAML)

{
  byte bVar1;
  bool bVar2;
  duration local_98;
  int local_90;
  int local_8c;
  duration<long,_std::ratio<1L,_1L>_> local_88;
  seconds refreshInterval;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> hostPort;
  bool local_5a;
  byte local_59;
  duration dStack_58;
  bool denyBaggageOnInitializationFailure;
  allocator local_39;
  string local_38 [32];
  Node *local_18;
  Node *configYAML_local;
  
  local_18 = configYAML;
  configYAML_local = (Node *)__return_storage_ptr__;
  bVar2 = YAML::Node::IsDefined(configYAML);
  if ((bVar2) && (bVar2 = YAML::Node::IsMap(local_18), bVar2)) {
    local_5a = false;
    local_59 = utils::yaml::findOrDefault<bool,char[35],bool>
                         (local_18,(char (*) [35])"denyBaggageOnInitializationFailure",&local_5a);
    utils::yaml::findOrDefault<std::__cxx11::string,char[9],char[1]>
              ((yaml *)&refreshInterval,local_18,(char (*) [9])"hostPort",(char (*) [1])0x12d06e);
    local_90 = 0;
    local_8c = utils::yaml::findOrDefault<int,char[16],int>
                         (local_18,(char (*) [16])"refreshInterval",&local_90);
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_88,&local_8c);
    bVar1 = local_59;
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
              ((duration<long,std::ratio<1l,1000000000l>> *)&local_98,&local_88);
    RestrictionsConfig(__return_storage_ptr__,(bool)(bVar1 & 1),(string *)&refreshInterval,&local_98
                      );
    std::__cxx11::string::~string((string *)&refreshInterval);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"",&local_39);
    dStack_58.__r = 0;
    RestrictionsConfig(__return_storage_ptr__,false,(string *)local_38,&stack0xffffffffffffffa8);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return __return_storage_ptr__;
}

Assistant:

static RestrictionsConfig parse(const YAML::Node& configYAML)
    {
        if (!configYAML.IsDefined() || !configYAML.IsMap()) {
            return RestrictionsConfig();
        }

        const auto denyBaggageOnInitializationFailure =
            utils::yaml::findOrDefault<bool>(
                configYAML, "denyBaggageOnInitializationFailure", false);
        const auto hostPort =
            utils::yaml::findOrDefault<std::string>(configYAML, "hostPort", "");
        const auto refreshInterval = std::chrono::seconds(
            utils::yaml::findOrDefault<int>(configYAML, "refreshInterval", 0));
        return RestrictionsConfig(
            denyBaggageOnInitializationFailure, hostPort, refreshInterval);
    }